

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

int __thiscall duckdb_re2::Compiler::AllocInst(Compiler *this,int n)

{
  Deleter DVar1;
  Inst *pIVar2;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false> _Var3;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false> _Var4;
  int iVar5;
  Inst *__dest;
  int iVar6;
  new_allocator<duckdb_re2::Prog::Inst> local_29;
  
  if (this->failed_ == false) {
    iVar5 = this->ninst_;
    iVar6 = iVar5 + n;
    if (iVar6 <= this->max_ninst_) {
      DVar1.len_ = *(int *)&(this->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                            .
                            super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                            .
                            super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false>
      ;
      if (DVar1.len_ < iVar6) {
        _Var3._M_head_impl.len_ = (Deleter)(Deleter)8;
        if (DVar1.len_ != 0) {
          _Var3._M_head_impl.len_ = (Deleter)(Deleter)DVar1.len_;
        }
        do {
          _Var4._M_head_impl.len_ = _Var3._M_head_impl.len_;
          _Var3._M_head_impl.len_ = (Deleter)(Deleter)(_Var4._M_head_impl.len_ * 2).len_;
        } while ((int)_Var4._M_head_impl.len_ < iVar6);
        __dest = __gnu_cxx::new_allocator<duckdb_re2::Prog::Inst>::allocate
                           (&local_29,(long)(int)_Var4._M_head_impl.len_,(void *)0x0);
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        if (pIVar2 != (Inst *)0x0) {
          memmove(__dest,pIVar2,(long)this->ninst_ << 3);
        }
        switchD_00569a20::default
                  (__dest + this->ninst_,0,
                   ((long)(int)_Var4._M_head_impl.len_ - (long)this->ninst_) * 8);
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        (this->inst_).ptr_._M_t.
        super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
        .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl = __dest;
        if (pIVar2 != (Inst *)0x0) {
          operator_delete(pIVar2);
        }
        (this->inst_).ptr_._M_t.
        super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
        .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>.
        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false> =
             (_Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter,_false>)
             _Var4._M_head_impl.len_;
        iVar5 = this->ninst_;
        iVar6 = n + iVar5;
      }
      this->ninst_ = iVar6;
      return iVar5;
    }
  }
  this->failed_ = true;
  return -1;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || ninst_ + n > max_ninst_) {
    failed_ = true;
    return -1;
  }

  if (ninst_ + n > inst_.size()) {
    int cap = inst_.size();
    if (cap == 0)
      cap = 8;
    while (ninst_ + n > cap)
      cap *= 2;
    PODArray<Prog::Inst> inst(cap);
    if (inst_.data() != NULL)
      memmove(inst.data(), inst_.data(), ninst_*sizeof inst_[0]);
    memset(inst.data() + ninst_, 0, (cap - ninst_)*sizeof inst_[0]);
    inst_ = std::move(inst);
  }
  int id = ninst_;
  ninst_ += n;
  return id;
}